

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void __thiscall
sisl::array_n<int,_3,_std::allocator<int>_>::_alloc
          (array_n<int,_3,_std::allocator<int>_> *this,uint n)

{
  int *piVar1;
  int local_24;
  ulong local_20;
  size_type i;
  array_n<int,_3,_std::allocator<int>_> *paStack_10;
  uint n_local;
  array_n<int,_3,_std::allocator<int>_> *this_local;
  
  if (n == 0) {
    this->_array = (int *)0x0;
  }
  else {
    i._4_4_ = n;
    paStack_10 = this;
    piVar1 = __gnu_cxx::new_allocator<int>::allocate
                       ((new_allocator<int> *)this,(ulong)n,(void *)0x0);
    this->first = piVar1;
    for (local_20 = 0; local_20 < i._4_4_; local_20 = local_20 + 1) {
      local_24 = 0;
      __gnu_cxx::new_allocator<int>::construct<int,int>
                ((new_allocator<int> *)this,this->first + local_20,&local_24);
    }
    this->last = this->first + local_20;
    this->_array = this->first;
  }
  return;
}

Assistant:

void _alloc(unsigned int n) {
            size_type i;
            if(n == 0) {
                this->_array = nullptr;
                return;
            }

            this->first = Allocator::allocate(n);
            try {
                for (i = 0; i < n; ++i) {
                    Allocator::construct(first + i, T());
                }
            }catch(...) {
                for(size_type j = 0; j < i; ++j) {
                     Allocator::destroy(first + j);
                }
                Allocator::deallocate(first, n);
                throw;
            }
            last = first + i;
            this->_array = static_cast<T *>(first);
        }